

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void tune_thresh_based_on_resolution
               (AV1_COMP *cpi,int64_t *thresholds,int64_t threshold_base,int current_qindex,
               int source_sad_rd,int num_pixels)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int64_t threshold_base_high;
  int64_t threshold_diff;
  int64_t qi_diff_high;
  int64_t qi_diff_low;
  int qindex_high_thr;
  int qindex_low_thr;
  int th_idx;
  int qindex_thr [5] [2];
  long local_98;
  int local_8c;
  int local_5c;
  int local_58 [14];
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  if (0xe0fff < in_R9D) {
    *(long *)(in_RSI + 0x18) = *(long *)(in_RSI + 0x18) << 1;
  }
  if (in_R9D < 0x18c01) {
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    memcpy(local_58,&DAT_00bc5a00,0x28);
    local_5c = 0;
    if (0 < *(int *)(local_8 + 0x60d90)) {
      if (local_20 < 3) {
        local_8c = *(int *)(local_8 + 0x60d90);
      }
      else {
        local_8c = 0;
      }
      local_5c = local_8c;
    }
    if (2 < *(int *)(local_8 + 0x60d90)) {
      local_5c = *(int *)(local_8 + 0x60d90);
    }
    iVar1 = local_58[(long)local_5c * 2];
    iVar2 = local_58[(long)local_5c * 2 + 1];
    if (local_1c < iVar2) {
      if (local_1c < iVar1) {
        *(long *)(local_10 + 8) = local_18 >> 3;
        *(long *)(local_10 + 0x10) = local_18 >> 1;
        *(long *)(local_10 + 0x18) = local_18 << 3;
      }
      else {
        lVar3 = (long)(local_1c - iVar1);
        lVar4 = (long)(iVar2 - local_1c);
        local_98 = (long)(iVar2 - iVar1);
        if (local_98 < 1) {
          local_98 = 1;
        }
        lVar5 = (lVar3 * (local_18 * 5 >> 1) + lVar4 * local_18) / local_98;
        *(long *)(local_10 + 8) = lVar5 >> 3;
        *(long *)(local_10 + 0x10) = (lVar3 * lVar5 + lVar4 * (lVar5 >> 1)) / local_98;
        *(long *)(local_10 + 0x18) = (lVar3 * lVar5 * 0x20 + lVar4 * lVar5 * 8) / local_98;
      }
    }
    else {
      lVar3 = local_18 * 5 >> 1;
      *(long *)(local_10 + 8) = local_18 * 5 >> 4;
      *(long *)(local_10 + 0x10) = lVar3 << 2;
      *(long *)(local_10 + 0x18) = lVar3 << 5;
    }
  }
  else if (in_R9D < 0xe1000) {
    *(long *)(in_RSI + 0x10) = in_RDX * 5 >> 2;
  }
  else if (in_R9D < 0x1fa400) {
    *(long *)(in_RSI + 0x10) = in_RDX << 1;
  }
  else if (*(int *)(in_RDI + 0x4269c) == 1) {
    if (in_R9D < 0x384000) {
      *(long *)(in_RSI + 0x10) = in_RDX * 5 >> 1;
    }
    else {
      *(long *)(in_RSI + 0x10) = in_RDX * 7 >> 1;
    }
  }
  else if (*(int *)(in_RDI + 0x4272c) < 8) {
    *(long *)(in_RSI + 0x10) = in_RDX * 3;
  }
  else {
    *(long *)(in_RSI + 0x10) = in_RDX * 6;
  }
  return;
}

Assistant:

static inline void tune_thresh_based_on_resolution(
    AV1_COMP *cpi, int64_t thresholds[], int64_t threshold_base,
    int current_qindex, int source_sad_rd, int num_pixels) {
  if (num_pixels >= RESOLUTION_720P) thresholds[3] = thresholds[3] << 1;
  if (num_pixels <= RESOLUTION_288P) {
    const int qindex_thr[5][2] = {
      { 200, 220 }, { 140, 170 }, { 120, 150 }, { 200, 210 }, { 170, 220 },
    };
    int th_idx = 0;
    if (cpi->sf.rt_sf.var_part_based_on_qidx >= 1)
      th_idx =
          (source_sad_rd <= kLowSad) ? cpi->sf.rt_sf.var_part_based_on_qidx : 0;
    if (cpi->sf.rt_sf.var_part_based_on_qidx >= 3)
      th_idx = cpi->sf.rt_sf.var_part_based_on_qidx;
    const int qindex_low_thr = qindex_thr[th_idx][0];
    const int qindex_high_thr = qindex_thr[th_idx][1];
    if (current_qindex >= qindex_high_thr) {
      threshold_base = (5 * threshold_base) >> 1;
      thresholds[1] = threshold_base >> 3;
      thresholds[2] = threshold_base << 2;
      thresholds[3] = threshold_base << 5;
    } else if (current_qindex < qindex_low_thr) {
      thresholds[1] = threshold_base >> 3;
      thresholds[2] = threshold_base >> 1;
      thresholds[3] = threshold_base << 3;
    } else {
      int64_t qi_diff_low = current_qindex - qindex_low_thr;
      int64_t qi_diff_high = qindex_high_thr - current_qindex;
      int64_t threshold_diff = qindex_high_thr - qindex_low_thr;
      int64_t threshold_base_high = (5 * threshold_base) >> 1;

      threshold_diff = threshold_diff > 0 ? threshold_diff : 1;
      threshold_base =
          (qi_diff_low * threshold_base_high + qi_diff_high * threshold_base) /
          threshold_diff;
      thresholds[1] = threshold_base >> 3;
      thresholds[2] = ((qi_diff_low * threshold_base) +
                       qi_diff_high * (threshold_base >> 1)) /
                      threshold_diff;
      thresholds[3] = ((qi_diff_low * (threshold_base << 5)) +
                       qi_diff_high * (threshold_base << 3)) /
                      threshold_diff;
    }
  } else if (num_pixels < RESOLUTION_720P) {
    thresholds[2] = (5 * threshold_base) >> 2;
  } else if (num_pixels < RESOLUTION_1080P) {
    thresholds[2] = threshold_base << 1;
  } else {
    // num_pixels >= RESOLUTION_1080P
    if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
      if (num_pixels < RESOLUTION_1440P) {
        thresholds[2] = (5 * threshold_base) >> 1;
      } else {
        thresholds[2] = (7 * threshold_base) >> 1;
      }
    } else {
      if (cpi->oxcf.speed > 7) {
        thresholds[2] = 6 * threshold_base;
      } else {
        thresholds[2] = 3 * threshold_base;
      }
    }
  }
}